

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborarray.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QCborArray *a)

{
  QList<QtCbor::Element> *pQVar1;
  QCborContainerPrivate *pQVar2;
  QCborContainerPrivate *pQVar3;
  DataPointer *pDVar4;
  storage_type *in_RCX;
  undefined8 *in_RDX;
  char *pcVar5;
  qsizetype qVar6;
  QString *this;
  long idx;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QDebugStateSaver saver;
  undefined1 local_68 [16];
  QDebugStateSaver local_58;
  QCborValue local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_58,(QDebug *)a);
  pQVar2 = (a->d).d.ptr;
  *(undefined1 *)&(pQVar2->elements).d.ptr = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QCborArray{";
  QString::fromUtf8((QString *)&local_50,(QString *)0xb,ba);
  QTextStream::operator<<((QTextStream *)pQVar2,(QString *)&local_50);
  if ((QArrayData *)local_50.n != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_50.n,2,0x10);
    }
  }
  pQVar2 = (a->d).d.ptr;
  if (*(char *)&(pQVar2->elements).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  pQVar2 = (QCborContainerPrivate *)*in_RDX;
  if (pQVar2 == (QCborContainerPrivate *)0x0) {
    qVar6 = 0;
  }
  else {
    qVar6 = (pQVar2->elements).d.size;
  }
  if (qVar6 != 0) {
    pcVar5 = "";
    idx = 0;
    do {
      pQVar3 = (a->d).d.ptr;
      this = (QString *)0xffffffffffffffff;
      do {
        pDVar4 = &this->d;
        this = (QString *)((long)&(this->d).d + 1);
      } while ((pcVar5 + 1)[(long)&pDVar4->d] != '\0');
      ba_00.m_data = in_RCX;
      ba_00.m_size = (qsizetype)pcVar5;
      QString::fromUtf8((QString *)&local_50,this,ba_00);
      QTextStream::operator<<((QTextStream *)pQVar3,(QString *)&local_50);
      if ((QArrayData *)local_50.n != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_50.n)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_50.n,2,0x10);
        }
      }
      pQVar3 = (a->d).d.ptr;
      if (*(char *)&(pQVar3->elements).d.ptr == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar3,' ');
      }
      local_68._0_8_ = (a->d).d.ptr;
      *(int *)&(((QCborContainerPrivate *)local_68._0_8_)->elements).d.d =
           *(int *)&(((QCborContainerPrivate *)local_68._0_8_)->elements).d.d + 1;
      QCborContainerPrivate::valueAt(&local_50,pQVar2,idx);
      operator<<((Stream *)(local_68 + 8),(QCborValue *)local_68);
      QDebug::~QDebug((QDebug *)(local_68 + 8));
      if (local_50.container != (QCborContainerPrivate *)0x0) {
        QCborContainerPrivate::deref(local_50.container);
      }
      QDebug::~QDebug((QDebug *)local_68);
      idx = idx + 1;
      pcVar5 = ", ";
    } while (idx != qVar6);
  }
  QTextStream::operator<<((QTextStream *)(a->d).d.ptr,'}');
  pQVar2 = (a->d).d.ptr;
  if (*(char *)&(pQVar2->elements).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  pQVar2 = (a->d).d.ptr;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar2;
  pQVar1 = &pQVar2->elements;
  *(int *)&(pQVar1->d).d = *(int *)&(pQVar1->d).d + 1;
  QDebugStateSaver::~QDebugStateSaver(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QCborArray &a)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QCborArray{";
    const char *comma = "";
    for (auto v : a) {
        dbg << comma << v;
        comma = ", ";
    }
    return dbg << '}';
}